

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NewTransaction(Fts5FullTable *pTab)

{
  int iVar1;
  Fts5Cursor *local_20;
  Fts5Cursor *pCsr;
  Fts5FullTable *pTab_local;
  
  local_20 = pTab->pGlobal->pCsr;
  while( true ) {
    if (local_20 == (Fts5Cursor *)0x0) {
      iVar1 = sqlite3Fts5StorageReset(pTab->pStorage);
      return iVar1;
    }
    if ((Fts5FullTable *)(local_20->base).pVtab == pTab) break;
    local_20 = local_20->pNext;
  }
  return 0;
}

Assistant:

static int fts5NewTransaction(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->base.pVtab==(sqlite3_vtab*)pTab ) return SQLITE_OK;
  }
  return sqlite3Fts5StorageReset(pTab->pStorage);
}